

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.nalg.c
# Opt level: O0

void pnga_transpose(Integer g_a,Integer g_b)

{
  int iVar1;
  int iVar2;
  void *buf;
  void *pvVar3;
  long g_a_00;
  Integer *lo_00;
  long in_RSI;
  long in_RDI;
  char *ptr;
  size_t bytes;
  int size;
  int i;
  Integer ncol;
  Integer nrow;
  Integer hib [2];
  Integer lob [2];
  Integer nelem;
  Integer block_dims [7];
  Integer idx;
  _iterator_hdl hdl;
  char *ptr_a;
  char *ptr_tmp;
  Integer num_blocks_a;
  int local_sync_end;
  int local_sync_begin;
  Integer ld [2];
  Integer hi [2];
  Integer lo [2];
  Integer bdims [7];
  Integer bndim;
  Integer adims [7];
  Integer andim;
  Integer btype;
  Integer atype;
  Integer nproc;
  Integer _ld [6];
  Integer me;
  Integer *in_stack_fffffffffffffb30;
  int iVar4;
  Integer *in_stack_fffffffffffffb68;
  char **in_stack_fffffffffffffb70;
  Integer *in_stack_fffffffffffffb78;
  Integer *in_stack_fffffffffffffb80;
  _iterator_hdl *in_stack_fffffffffffffb88;
  _iterator_hdl *in_stack_fffffffffffffbf8;
  Integer in_stack_fffffffffffffc00;
  Integer in_stack_fffffffffffffcc8;
  char *in_stack_fffffffffffffcd0;
  Integer *in_stack_fffffffffffffd38;
  Integer *in_stack_fffffffffffffd40;
  Integer *in_stack_fffffffffffffd48;
  Integer in_stack_fffffffffffffd50;
  long local_108;
  long local_100;
  char **local_f8;
  Integer *local_f0;
  long local_b0;
  long local_68;
  long local_60;
  long local_58;
  
  pnga_nodeid();
  pnga_nnodes();
  iVar1 = _ga_sync_end;
  iVar2 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar2 != 0) {
    pnga_sync();
  }
  if (in_RDI == in_RSI) {
    pnga_error(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  }
  pnga_inquire(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
               in_stack_fffffffffffffd38);
  pnga_inquire(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
               in_stack_fffffffffffffd38);
  if ((local_b0 != 2) || (local_68 != 2)) {
    pnga_error(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  }
  if (local_58 != local_60) {
    pnga_error(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  }
  pnga_local_iterator_init(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  while( true ) {
    iVar2 = pnga_local_iterator_next
                      (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78
                       ,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    if (iVar2 == 0) break;
    iVar2 = (int)ga_types[local_58 + -1000].size;
    buf = (void *)(((local_108 - (long)local_f8) + 1) * ((local_100 - (long)local_f0) + 1) *
                  (long)iVar2);
    pvVar3 = ARMCI_Malloc_local(0x185bc2);
    g_a_00 = (local_108 - (long)local_f8) + 1;
    lo_00 = (Integer *)((local_100 - (long)local_f0) + 1);
    in_stack_fffffffffffffb80 = (Integer *)(g_a_00 * (long)lo_00);
    in_stack_fffffffffffffb68 = local_f0;
    in_stack_fffffffffffffb70 = local_f8;
    for (iVar4 = 0; (long)iVar4 < (long)lo_00; iVar4 = iVar4 + 1) {
      in_stack_fffffffffffffb30 = (Integer *)((long)pvVar3 + (long)(iVar4 * iVar2));
      snga_local_transpose
                (g_a_00,(char *)lo_00,CONCAT44(iVar4,iVar2),(Integer)buf,
                 (char *)in_stack_fffffffffffffb30);
    }
    pnga_put(g_a_00,lo_00,(Integer *)CONCAT44(iVar4,iVar2),buf,in_stack_fffffffffffffb30);
    ARMCI_Free_local((void *)0x185cff);
  }
  if (iVar1 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_transpose(Integer g_a, Integer g_b)
{
Integer me = pnga_nodeid();
Integer _ld[MAXDIM-1];
Integer nproc = pnga_nnodes(); 
Integer atype, btype, andim, adims[MAXDIM], bndim, bdims[MAXDIM];
Integer lo[2],hi[2],ld[2];
int local_sync_begin,local_sync_end;
Integer num_blocks_a;
char *ptr_tmp, *ptr_a;
_iterator_hdl hdl;

    
    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(local_sync_begin)pnga_sync();

    if(g_a == g_b) pnga_error("arrays have to be different ", 0L);

    pnga_inquire(g_a, &atype, &andim, adims);
    pnga_inquire(g_b, &btype, &bndim, bdims);

    if(bndim != 2 || andim != 2) pnga_error("dimension must be 2",0);
    if(atype != btype ) pnga_error("array type mismatch ", 0L);

#if 1
    pnga_local_iterator_init(g_a, &hdl);
    while (pnga_local_iterator_next(&hdl,lo,hi,&ptr_a,ld)) {
      Integer idx;
      Integer block_dims[MAXDIM];
      Integer nelem, lob[2], hib[2], nrow, ncol;
      int i, size=GAsizeofM(atype);

      nelem = (hi[0]-lo[0]+1)*(hi[1]-lo[1]+1);
#ifdef GA_TRANSPOSE_USE_ARMCI_MEM
{
      size_t bytes = nelem * size;
      ptr_tmp = ARMCI_Malloc_local(bytes);
}
#else
      ptr_tmp = (char *) pnga_malloc(nelem, atype, "transpose_tmp");
#endif

      nrow   = hi[0] -lo[0]+1;
      ncol   = hi[1] -lo[1]+1; 
      nelem  = nrow*ncol;
      lob[0] = lo[1]; lob[1] = lo[0];
      hib[0] = hi[1]; hib[1] = hi[0];
      for(i = 0; i < ncol; i++){
        char *ptr = ptr_tmp + i*size;

        snga_local_transpose(atype, ptr_a, nrow, ncol*size, ptr);
        ptr_a += ld[0]*size;
      }
      pnga_put(g_b, lob, hib, ptr_tmp ,&ncol);
#ifdef GA_TRANSPOSE_USE_ARMCI_MEM
      ARMCI_Free_local(ptr_tmp);
#else
      pnga_free(ptr_tmp);
#endif
    }
#else
    num_blocks_a = pnga_total_blocks(g_a);

    if (num_blocks_a < 0) {
      pnga_distribution(g_a, me, lo, hi);

      if(lo[0]>0){
        Integer nelem, lob[2], hib[2], nrow, ncol;
        int i, size=GAsizeofM(atype);

        nrow   = hi[0] -lo[0]+1;
        ncol   = hi[1] -lo[1]+1; 
        nelem  = nrow*ncol;
        lob[0] = lo[1]; lob[1] = lo[0];
        hib[0] = hi[1]; hib[1] = hi[0];

        /* allocate memory for transposing elements locally */
        ptr_tmp = (char *) ga_malloc(nelem, atype, "transpose_tmp");

        /* get access to local data */
        pnga_access_ptr(g_a, lo, hi, &ptr_a, _ld);

        for(i = 0; i < ncol; i++){
          char *ptr = ptr_tmp + i*size;

          snga_local_transpose(atype, ptr_a, nrow, ncol*size, ptr);
          ptr_a += _ld[0]*size;
        }

        pnga_release(g_a, lo, hi); 

        pnga_put(g_b, lob, hib, ptr_tmp ,&ncol);

        ga_free(ptr_tmp);
      }
    } else {
      Integer idx;
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      Integer nelem, lob[2], hib[2], nrow, ncol;
      int i, size=GAsizeofM(atype);

      /* allocate memory for transposing elements locally */
      pnga_get_block_info(g_a, blocks, block_dims);

      /* Simple block-cyclic data distribution */
      nelem = block_dims[0]*block_dims[1];
      ptr_tmp = (char *) ga_malloc(nelem, atype, "transpose_tmp");
      if (!pnga_uses_proc_grid(g_a)) {
        for (idx = me; idx < num_blocks_a; idx += nproc) {
          pnga_distribution(g_a, idx, lo, hi);
          pnga_access_block_ptr(g_a, idx, &ptr_a, _ld);

          nrow   = hi[0] -lo[0]+1;
          ncol   = hi[1] -lo[1]+1; 
          nelem  = nrow*ncol;
          lob[0] = lo[1]; lob[1] = lo[0];
          hib[0] = hi[1]; hib[1] = hi[0];
          for(i = 0; i < ncol; i++){
            char *ptr = ptr_tmp + i*size;

            snga_local_transpose(atype, ptr_a, nrow, ncol*size, ptr);
            ptr_a += _ld[0]*size;
          }
          pnga_put(g_b, lob, hib, ptr_tmp ,&ncol);

          pnga_release_update_block(g_a, idx);
        }
      } else {
        /* Uses scalapack block-cyclic data distribution */
        Integer chk;
        Integer proc_index[MAXDIM], index[MAXDIM];
        Integer topology[MAXDIM], ichk;

        pnga_get_proc_index(g_a, me, proc_index);
        pnga_get_proc_index(g_a, me, index);
        pnga_get_block_info(g_a, blocks, block_dims);
        pnga_get_proc_grid(g_a, topology);
        /* Verify that processor has data */
        ichk = 1;
        for (i=0; i<andim; i++) {
          if (index[i]<0 || index[i] >= blocks[i]) {
            ichk = 0;
          }
        }

        if (ichk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr_a, _ld);
          while (index[andim-1] < blocks[andim-1]) {
            /* find bounding coordinates of block */
            chk = 1;
            for (i = 0; i < andim; i++) {
              lo[i] = index[i]*block_dims[i]+1;
              hi[i] = (index[i] + 1)*block_dims[i];
              if (hi[i] > adims[i]) hi[i] = adims[i];
              if (hi[i] < lo[i]) chk = 0;
            }
            if (chk) {
              pnga_access_block_grid_ptr(g_a, index, &ptr_a, _ld);
              nrow   = hi[0] -lo[0]+1;
              ncol   = hi[1] -lo[1]+1; 
              nelem  = nrow*ncol;
              lob[0] = lo[1]; lob[1] = lo[0];
              hib[0] = hi[1]; hib[1] = hi[0];
              for(i = 0; i < ncol; i++){
                char *ptr = ptr_tmp + i*size;
                snga_local_transpose(atype, ptr_a, nrow, block_dims[0]*size, ptr);
                ptr_a += _ld[0]*size;
              }
              pnga_put(g_b, lob, hib, ptr_tmp ,&block_dims[0]);
              pnga_release_update_block_grid(g_a, index);
            }
            /* increment index to get next block on processor */
            index[0] += topology[0];
            for (i = 0; i < andim; i++) {
              if (index[i] >= blocks[i] && i<andim-1) {
                index[i] = proc_index[i];
                index[i+1] += topology[i+1];
              }
            }
          }
        }
      }
      ga_free(ptr_tmp);
    }
#endif
    if(local_sync_end)pnga_sync();
}